

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

int av1_rc_get_default_min_gf_interval(int width,int height,double framerate)

{
  int iVar1;
  int iVar2;
  double dVar3;
  
  dVar3 = (double)height * (double)width * framerate;
  iVar2 = 0x20;
  if ((int)(framerate * 0.125) < 0x20) {
    iVar2 = (int)(framerate * 0.125);
  }
  iVar1 = 4;
  if (4 < iVar2) {
    iVar1 = iVar2;
  }
  iVar2 = iVar1;
  if ((165888000.0 < dVar3) && (iVar2 = (int)((dVar3 * 4.0) / 165888000.0 + 0.5), iVar2 < iVar1)) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int av1_rc_get_default_min_gf_interval(int width, int height,
                                       double framerate) {
  // Assume we do not need any constraint lower than 4K 20 fps
  static const double factor_safe = 3840 * 2160 * 20.0;
  const double factor = (double)width * height * framerate;
  const int default_interval =
      clamp((int)(framerate * 0.125), MIN_GF_INTERVAL, MAX_GF_INTERVAL);

  if (factor <= factor_safe)
    return default_interval;
  else
    return AOMMAX(default_interval,
                  (int)(MIN_GF_INTERVAL * factor / factor_safe + 0.5));
  // Note this logic makes:
  // 4K24: 5
  // 4K30: 6
  // 4K60: 12
}